

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

UnaryOperator __thiscall Parser::unaryOperatorFromToken(Parser *this,Token *token)

{
  TokenType TVar1;
  UnaryOperator UVar2;
  runtime_error *this_00;
  
  TVar1 = token->type;
  if (TVar1 == Minus) {
    UVar2 = Minus;
  }
  else if (TVar1 == LogicalNot) {
    UVar2 = LogicalNot;
  }
  else {
    if (TVar1 != BinaryNot) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unexpected token for unary operator!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    UVar2 = BinaryNegation;
  }
  return UVar2;
}

Assistant:

UnaryOperator Parser::unaryOperatorFromToken(const Token& token) const
{
  const auto type = token.type;
  switch(type)
  {
    case TokenType::Minus:
      return UnaryOperator::Minus;
    case TokenType::BinaryNot:
      return UnaryOperator::BinaryNegation;
    case TokenType::LogicalNot:
      return UnaryOperator::LogicalNot;
    default:
      throw std::runtime_error("Unexpected token for unary operator!");
  }
}